

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall google::protobuf::ValidateQualifiedName(protobuf *this,string_view name)

{
  protobuf pVar1;
  bool bVar2;
  bool bVar3;
  protobuf *ppVar4;
  const_iterator __begin2;
  byte bVar5;
  bool bVar6;
  
  bVar6 = this == (protobuf *)0x0;
  if (bVar6) {
    bVar3 = false;
  }
  else {
    ppVar4 = (protobuf *)0x0;
    bVar2 = false;
    bVar3 = false;
    do {
      pVar1 = ppVar4[name._M_len];
      bVar5 = 1;
      if (((byte)(((byte)pVar1 & 0xdf) + 0xbf) < 0x1a) ||
         (pVar1 == (protobuf)0x5f || (byte)((char)pVar1 - 0x30U) < 10)) {
        bVar3 = false;
        bVar2 = false;
      }
      else if (pVar1 == (protobuf)0x2e) {
        bVar3 = bVar2;
        if (!bVar2) {
          bVar3 = true;
        }
        bVar5 = bVar2 ^ 1;
        bVar2 = bVar3;
      }
      else {
        bVar5 = 0;
      }
      if (bVar5 == 0) break;
      ppVar4 = ppVar4 + 1;
      bVar6 = this == ppVar4;
    } while (!bVar6);
  }
  return (bool)((bVar3 ^ 1U) & this != (protobuf *)0x0 & bVar6);
}

Assistant:

static bool ValidateQualifiedName(absl::string_view name) {
  bool last_was_period = false;

  for (char character : name) {
    // I don't trust isalnum() due to locales.  :(
    if (('a' <= character && character <= 'z') ||
        ('A' <= character && character <= 'Z') ||
        ('0' <= character && character <= '9') || (character == '_')) {
      last_was_period = false;
    } else if (character == '.') {
      if (last_was_period) return false;
      last_was_period = true;
    } else {
      return false;
    }
  }

  return !name.empty() && !last_was_period;
}